

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::GetCostDataFile_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  bool bVar1;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_50,"CostDataFile",(allocator *)&local_30);
  GetCTestConfiguration(__return_storage_ptr__,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = std::operator==(__return_storage_ptr__,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_30,(string *)&this->BinaryDir);
    std::operator+(&local_50,&local_30,"/Testing/Temporary/CTestCostData.txt");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetCostDataFile()
{
  std::string fname = this->GetCTestConfiguration("CostDataFile");
  if (fname == "") {
    fname = this->GetBinaryDir() + "/Testing/Temporary/CTestCostData.txt";
  }
  return fname;
}